

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

u32 calculate_min_match_len(u8 *data,size_t data_len,u32 max_search_depth)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  u32 uVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  u8 used [256];
  undefined4 local_118 [64];
  
  memset(local_118,0,0x100);
  if (data_len < 0x200) {
    return 3;
  }
  sVar8 = 0x1000;
  if (data_len < 0x1000) {
    sVar8 = data_len;
  }
  sVar10 = 0;
  do {
    *(undefined1 *)((long)local_118 + (ulong)data[sVar10]) = 1;
    sVar10 = sVar10 + 1;
  } while (sVar8 != sVar10);
  lVar9 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar14 = 0;
  do {
    uVar1 = *(undefined4 *)((long)local_118 + lVar9);
    uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar5;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar5;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar11 = iVar11 + (int)uVar5;
    iVar12 = iVar12 + auVar4._4_4_;
    iVar13 = iVar13 + auVar3._8_4_;
    iVar14 = iVar14 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x100);
  uVar7 = choose_min_match_len(iVar14 + iVar12 + iVar13 + iVar11,max_search_depth);
  return uVar7;
}

Assistant:

static u32
calculate_min_match_len(const u8 *data, size_t data_len, u32 max_search_depth)
{
	u8 used[256] = { 0 };
	u32 num_used_literals = 0;
	size_t i;

	/*
	 * For very short inputs, the static Huffman code has a good chance of
	 * being best, in which case there is no reason to avoid short matches.
	 */
	if (data_len < 512)
		return DEFLATE_MIN_MATCH_LEN;

	/*
	 * For an initial approximation, scan the first 4 KiB of data.  The
	 * caller may use recalculate_min_match_len() to update min_len later.
	 */
	data_len = MIN(data_len, 4096);
	for (i = 0; i < data_len; i++)
		used[data[i]] = 1;
	for (i = 0; i < 256; i++)
		num_used_literals += used[i];
	return choose_min_match_len(num_used_literals, max_search_depth);
}